

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall S2Loop::BoundaryNear(S2Loop *this,S2Loop *b,S1Angle max_error)

{
  pair<int,_int> *ppVar1;
  pair<int,_int> *ppVar2;
  int iVar3;
  int i;
  int iVar4;
  bool bVar5;
  const_iterator cVar6;
  S2Point *pSVar7;
  S2Point *pSVar8;
  S2Point *pSVar9;
  int iVar10;
  uint uVar11;
  pair<int,_int> pVar12;
  pair<int,_int> pVar13;
  int iVar14;
  S1Angle SVar15;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> pending;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  done;
  pair<int,_int> local_a0;
  S2Loop *local_98;
  S2Loop *local_90;
  pair<int,_int> *local_88;
  iterator iStack_80;
  pair<int,_int> *local_78;
  ulong local_70;
  double local_68;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_60;
  
  if (this->num_vertices_ == 1) {
    if ((this->origin_inside_ & 1U) == 0) {
      bVar5 = (bool)((b->origin_inside_ ^ 1U) & b->num_vertices_ == 1);
    }
    else {
      bVar5 = (bool)(b->num_vertices_ == 1 & b->origin_inside_);
    }
  }
  else {
    bVar5 = false;
    if (0 < this->num_vertices_ && b->num_vertices_ != 1) {
      local_70 = 0;
      local_98 = b;
      local_90 = this;
      local_68 = max_error.radians_;
      do {
        local_88 = (pair<int,_int> *)0x0;
        iStack_80._M_current = (pair<int,_int> *)0x0;
        local_78 = (pair<int,_int> *)0x0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_a0.first = 0;
        local_a0.second = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_88,
                   (iterator)0x0,&local_a0);
        if (local_88 == iStack_80._M_current) {
          bVar5 = false;
        }
        else {
          do {
            ppVar1 = iStack_80._M_current + -1;
            ppVar2 = iStack_80._M_current + -1;
            iVar3 = ppVar2->first;
            i = iStack_80._M_current[-1].second;
            bVar5 = b->num_vertices_ == i && local_90->num_vertices_ == iVar3;
            iStack_80._M_current = ppVar1;
            if (bVar5) break;
            local_a0 = *ppVar2;
            std::
            _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
            ::_M_insert_unique<std::pair<int,int>>
                      ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)&local_60,&local_a0);
            iVar14 = iVar3 + (int)local_70;
            iVar4 = local_90->num_vertices_;
            iVar10 = iVar4;
            if (iVar14 < iVar4) {
              iVar10 = 0;
            }
            iVar14 = iVar14 - iVar10;
            if (iVar3 < iVar4) {
              pVar12.second = i;
              pVar12.first = iVar3 + 1;
              local_a0 = pVar12;
              cVar6 = std::
                      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                      ::find(&local_60,&local_a0);
              b = local_98;
              if ((_Rb_tree_header *)cVar6._M_node == &local_60._M_impl.super__Rb_tree_header) {
                pSVar7 = vertex(local_90,iVar14 + 1);
                pSVar8 = vertex(local_98,i);
                pSVar9 = vertex(local_98,i + 1);
                SVar15 = S2::GetDistance(pSVar7,pSVar8,pSVar9);
                b = local_98;
                if (SVar15.radians_ <= local_68) {
                  if (iStack_80._M_current == local_78) {
                    local_a0 = pVar12;
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_realloc_insert<std::pair<int,int>>
                              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                               &local_88,iStack_80,&local_a0);
                  }
                  else {
                    *iStack_80._M_current = pVar12;
                    iStack_80._M_current = iStack_80._M_current + 1;
                    local_a0 = pVar12;
                  }
                }
              }
            }
            if (i < b->num_vertices_) {
              pVar13.second = i + 1;
              pVar13.first = iVar3;
              local_a0 = pVar13;
              cVar6 = std::
                      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                      ::find(&local_60,&local_a0);
              b = local_98;
              if ((_Rb_tree_header *)cVar6._M_node == &local_60._M_impl.super__Rb_tree_header) {
                pSVar7 = vertex(local_98,i + 1);
                pSVar8 = vertex(local_90,iVar14);
                pSVar9 = vertex(local_90,iVar14 + 1);
                SVar15 = S2::GetDistance(pSVar7,pSVar8,pSVar9);
                b = local_98;
                if (SVar15.radians_ <= local_68) {
                  if (iStack_80._M_current == local_78) {
                    local_a0 = pVar13;
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_realloc_insert<std::pair<int,int>>
                              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                               &local_88,iStack_80,&local_a0);
                  }
                  else {
                    *iStack_80._M_current = pVar13;
                    iStack_80._M_current = iStack_80._M_current + 1;
                    local_a0 = pVar13;
                  }
                }
              }
            }
          } while (local_88 != iStack_80._M_current);
        }
        std::
        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        ::~_Rb_tree(&local_60);
        if (local_88 != (pair<int,_int> *)0x0) {
          operator_delete(local_88);
        }
      } while ((bVar5 == false) &&
              (uVar11 = (int)local_70 + 1, local_70 = (ulong)uVar11,
              (int)uVar11 < local_90->num_vertices_));
    }
  }
  return bVar5;
}

Assistant:

bool S2Loop::BoundaryNear(const S2Loop& b, S1Angle max_error) const {
  // Special case to handle empty or full loops.
  if (is_empty_or_full() || b.is_empty_or_full()) {
    return (is_empty() && b.is_empty()) || (is_full() && b.is_full());
  }

  for (int a_offset = 0; a_offset < num_vertices(); ++a_offset) {
    if (MatchBoundaries(*this, b, a_offset, max_error)) return true;
  }
  return false;
}